

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O2

void __thiscall
swrenderer::WallSampler::WallSampler
          (WallSampler *this,int y1,float swal,double yrepeat,fixed_t xoffset,FTexture *texture,
          _func_BYTE_ptr_FTexture_ptr_int *getcol)

{
  ushort uVar1;
  uint uVar2;
  BYTE *pBVar3;
  uint32_t uVar4;
  uint uVar5;
  byte bVar6;
  uint32_t uVar7;
  double __x;
  double dVar8;
  double dVar9;
  double dVar10;
  
  uVar1 = texture->Height;
  this->height = (uint)uVar1;
  if (texture->HeightBits == '\0') {
    uVar4 = 0;
    uVar7 = 1;
    uVar2 = 0;
  }
  else {
    bVar6 = -texture->HeightBits;
    dVar10 = (double)uVar1;
    uVar7 = (uint)uVar1 << (bVar6 & 0x1f);
    __x = ((((double)y1 + 0.5) - CenterY) * (double)swal * yrepeat + dc_texturemid) / dVar10;
    dVar8 = floor(__x);
    dVar9 = (double)(1 << (bVar6 & 0x1f));
    uVar4 = (uint32_t)(long)(dVar10 * dVar9 * (__x - dVar8));
    uVar5 = SUB84(6755399441055744.0 / dVar9 + (double)swal * yrepeat,0);
    uVar2 = 1;
    if (1 < uVar5) {
      uVar2 = uVar5;
    }
  }
  this->uv_pos = uVar4;
  this->uv_step = uVar2;
  this->uv_max = uVar7;
  pBVar3 = (*getcol)(texture,xoffset >> 0x10);
  this->source = pBVar3;
  return;
}

Assistant:

WallSampler::WallSampler(int y1, float swal, double yrepeat, fixed_t xoffset, FTexture *texture, const BYTE*(*getcol)(FTexture *texture, int x))
{
	height = texture->GetHeight();

	int uv_fracbits = 32 - texture->HeightBits;
	if (uv_fracbits != 32)
	{
		uv_max = height << uv_fracbits;

		// Find start uv in [0-base_height[ range.
		// Not using xs_ToFixed because it rounds the result and we need something that always rounds down to stay within the range.
		double uv_stepd = swal * yrepeat;
		double v = (dc_texturemid + uv_stepd * (y1 - CenterY + 0.5)) / height;
		v = v - floor(v);
		v *= height;
		v *= (1 << uv_fracbits);

		uv_pos = (uint32_t)v;
		uv_step = xs_ToFixed(uv_fracbits, uv_stepd);
		if (uv_step == 0) // To prevent divide by zero elsewhere
			uv_step = 1;
	}
	else
	{ // Hack for one pixel tall textures
		uv_pos = 0;
		uv_step = 0;
		uv_max = 1;
	}

	source = getcol(texture, xoffset >> FRACBITS);
}